

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

vector<float,_pstd::pmr::polymorphic_allocator<float>_> * __thiscall
pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
          (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *this,
          vector<float,_pstd::pmr::polymorphic_allocator<float>_> *other)

{
  bool bVar1;
  size_t sVar2;
  reference args;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_RSI;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_RDI;
  size_t i;
  polymorphic_allocator<float> *in_stack_ffffffffffffffc8;
  float *p;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_ffffffffffffffd0;
  size_type sVar3;
  size_type local_20;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *this_00;
  
  if (in_RDI != in_RSI) {
    this_00 = in_RDI;
    bVar1 = pmr::operator==(&in_stack_ffffffffffffffd0->alloc,in_stack_ffffffffffffffc8);
    if (bVar1) {
      swap<float*>(&in_RDI->ptr,&in_RSI->ptr);
      swap<unsigned_long>(&in_RDI->nAlloc,&in_RSI->nAlloc);
      swap<unsigned_long>(&in_RDI->nStored,&in_RSI->nStored);
    }
    else {
      clear(in_stack_ffffffffffffffd0);
      size(in_RSI);
      reserve(this_00,(size_t)in_RSI);
      local_20 = 0;
      while (sVar3 = local_20, sVar2 = size(in_RSI), sVar3 < sVar2) {
        p = in_RDI->ptr + local_20;
        args = operator[](in_RSI,local_20);
        pmr::polymorphic_allocator<float>::construct<float,float>(&in_RDI->alloc,p,args);
        local_20 = local_20 + 1;
      }
      sVar2 = size(in_RSI);
      in_RDI->nStored = sVar2;
    }
  }
  return in_RDI;
}

Assistant:

vector &operator=(vector &&other) {
        if (this == &other)
            return *this;

        if (alloc == other.alloc) {
            pstd::swap(ptr, other.ptr);
            pstd::swap(nAlloc, other.nAlloc);
            pstd::swap(nStored, other.nStored);
        } else {
            clear();
            reserve(other.size());
            for (size_t i = 0; i < other.size(); ++i)
                alloc.template construct<T>(ptr + i, std::move(other[i]));
            nStored = other.size();
        }

        return *this;
    }